

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdline.h
# Opt level: O0

string * cmdline::detail::demangle(string *name)

{
  undefined8 uVar1;
  allocator<char> *__a;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  string *in_RDI;
  char *p;
  int status;
  string *ret;
  allocator<char> local_22;
  undefined1 local_21;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 uVar2;
  
  uVar2 = 0;
  uVar1 = std::__cxx11::string::c_str();
  __a = (allocator<char> *)__cxa_demangle(uVar1,0,0,&stack0xffffffffffffffec);
  local_21 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_RSI,(char *)CONCAT44(uVar2,in_stack_ffffffffffffffe8),__a);
  std::allocator<char>::~allocator(&local_22);
  free(__a);
  return in_RDI;
}

Assistant:

static inline std::string demangle(const std::string& name) {
    int status = 0;
    char* p = abi::__cxa_demangle(name.c_str(), 0, 0, &status);
    std::string ret(p);
    free(p);
    return ret;
}